

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::bitselectV128
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Literal local_68;
  Literal local_50;
  Literal local_38;
  
  andV128(&local_68,this,left);
  notV128(&local_38,this);
  andV128(&local_50,&local_38,right);
  orV128(__return_storage_ptr__,&local_68,&local_50);
  ~Literal(&local_50);
  ~Literal(&local_38);
  ~Literal(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitselectV128(const Literal& left,
                               const Literal& right) const {
  return andV128(left).orV128(notV128().andV128(right));
}